

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFlow.c
# Opt level: O0

int Nwk_ManPushBackwardBot_rec(Nwk_Obj_t *pObj,Nwk_Obj_t *pPred)

{
  int iVar1;
  Nwk_Obj_t *pNVar2;
  Nwk_Obj_t *pPred_00;
  Nwk_Obj_t *pPred_local;
  Nwk_Obj_t *pObj_local;
  
  iVar1 = Nwk_ObjVisitedBot(pObj);
  if (iVar1 == 0) {
    Nwk_ObjSetVisitedBot(pObj);
    iVar1 = Nwk_ObjHasFlow(pObj);
    if (iVar1 == 0) {
      iVar1 = Nwk_ManPushBackwardTop_rec(pObj,pObj);
      if (iVar1 != 0) {
        Nwk_ObjSetFlow(pObj);
        iVar1 = Nwk_ObjSetPred(pObj,pPred);
        return iVar1;
      }
    }
    else {
      pNVar2 = Nwk_ObjPred(pObj);
      if (pNVar2 != (Nwk_Obj_t *)0x0) {
        pNVar2 = Nwk_ObjPred(pObj);
        pPred_00 = Nwk_ObjPred(pObj);
        iVar1 = Nwk_ManPushBackwardTop_rec(pNVar2,pPred_00);
        if (iVar1 != 0) {
          iVar1 = Nwk_ObjSetPred(pObj,pPred);
          return iVar1;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Nwk_ManPushBackwardBot_rec( Nwk_Obj_t * pObj, Nwk_Obj_t * pPred )
{
    if ( Nwk_ObjVisitedBot(pObj) )
        return 0;
    Nwk_ObjSetVisitedBot(pObj);
    // propagate through the internal edge
    if ( Nwk_ObjHasFlow(pObj) )
    {
        if ( Nwk_ObjPred(pObj) )
            if ( Nwk_ManPushBackwardTop_rec( Nwk_ObjPred(pObj), Nwk_ObjPred(pObj) ) )
                return Nwk_ObjSetPred( pObj, pPred ); 
    }
    else if ( Nwk_ManPushBackwardTop_rec(pObj, pObj) )
    {
        Nwk_ObjSetFlow( pObj );
        return Nwk_ObjSetPred( pObj, pPred );
    }
    return 0;
}